

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O0

int fy_atom_format_text_length(fy_atom *atom)

{
  int local_214;
  long lStack_210;
  int ret;
  size_t len;
  fy_iter_chunk *ic;
  fy_atom_iter iter;
  fy_atom *atom_local;
  
  if (atom == (fy_atom *)0x0) {
    atom_local._4_4_ = -1;
  }
  else if ((*(uint *)&atom->field_0x34 >> 0xb & 1) == 0) {
    lStack_210 = 0;
    iter._480_8_ = atom;
    fy_atom_iter_start(atom,(fy_atom_iter *)&ic);
    len = 0;
    while( true ) {
      len = (size_t)fy_atom_iter_chunk_next((fy_atom_iter *)&ic,(fy_iter_chunk *)len,&local_214);
      if ((fy_iter_chunk *)len == (fy_iter_chunk *)0x0) break;
      lStack_210 = ((fy_iter_chunk *)len)->len + lStack_210;
    }
    fy_atom_iter_finish((fy_atom_iter *)&ic);
    atom_local._4_4_ = (int)lStack_210;
    if (atom_local._4_4_ < 0) {
      atom_local._4_4_ = -1;
    }
    else if (local_214 == 0) {
      *(long *)(iter._480_8_ + 0x20) = lStack_210;
      *(uint *)(iter._480_8_ + 0x34) = *(uint *)(iter._480_8_ + 0x34) & 0xfffff7ff | 0x800;
    }
    else {
      atom_local._4_4_ = local_214;
    }
  }
  else {
    atom_local._4_4_ = (int)atom->storage_hint;
  }
  return atom_local._4_4_;
}

Assistant:

int fy_atom_format_text_length(struct fy_atom *atom) {
    struct fy_atom_iter iter;
    const struct fy_iter_chunk *ic;
    size_t len;
    int ret;

    if (!atom)
        return -1;

    if (atom->storage_hint_valid)
        return atom->storage_hint;

    len = 0;
    fy_atom_iter_start(atom, &iter);
    ic = NULL;
    while ((ic = fy_atom_iter_chunk_next(&iter, ic, &ret)) != NULL)
        len += ic->len;
    fy_atom_iter_finish(&iter);

    /* something funky going on here */
    if ((int) len < 0)
        return -1;

    if (ret != 0)
        return ret;

    atom->storage_hint = (size_t) len;
    atom->storage_hint_valid = true;
    return (int) len;
}